

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_double_field
          (OneofWellKnownTypes *this,DoubleValue *double_field)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  DoubleValue *double_field_local;
  OneofWellKnownTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (double_field != (DoubleValue *)0x0) {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)double_field);
    message_arena = (Arena *)double_field;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<google::protobuf::DoubleValue>
                              (message_arena_00,double_field,submessage_arena_00);
    }
    set_has_double_field(this);
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_double_field(::google::protobuf::DoubleValue* PROTOBUF_NULLABLE double_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (double_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(double_field)->GetArena();
    if (message_arena != submessage_arena) {
      double_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, double_field, submessage_arena);
    }
    set_has_double_field();
    _impl_.oneof_field_.double_field_ = double_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.double_field)
}